

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  Var *this_00;
  ExprList *out_expr_list;
  bool bVar1;
  Result RVar2;
  DataSegmentModuleField *pDVar3;
  Enum EVar4;
  Location loc;
  string name;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_e0;
  Location local_d8;
  Token local_b8;
  Var local_78;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_b8,this);
  local_d8.field_1.field_1.offset._1_7_ = local_b8.loc.field_1.field_1.offset._1_7_;
  local_d8.field_1.field2[0] = local_b8.loc.field_1.field2[0];
  local_d8.field_1._8_8_ = local_b8.loc.field_1._8_8_;
  local_d8.filename._M_len = local_b8.loc.filename._M_len;
  local_d8.filename._M_str = local_b8.loc.filename._M_str;
  RVar2 = Expect(this,Data);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  local_b8.loc.filename._M_len = (size_t)&local_b8.loc.field_1;
  local_b8.loc.filename._M_str = (char *)0x0;
  local_b8.loc.field_1.field2[0] = 0;
  ParseBindVarOpt(this,(string *)&local_b8);
  pDVar3 = (DataSegmentModuleField *)operator_new(0xe0);
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ModuleField_001a3a50;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.field_1.field_0.
  line = local_d8.field_1.field_0.line;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.field_1.field_0.
  first_column = local_d8.field_1.field_0.first_column;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.field_1.field_0.
  last_column = local_d8.field_1.field_0.last_column;
  *(undefined4 *)
   ((long)&(pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.field_1
   + 0xc) = local_d8.field_1._12_4_;
  *(undefined4 *)
   &(pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.filename._M_len
       = (undefined4)local_d8.filename._M_len;
  *(undefined4 *)
   ((long)&(pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.filename
           ._M_len + 4) = local_d8.filename._M_len._4_4_;
  *(undefined4 *)
   &(pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.filename._M_str
       = local_d8.filename._M_str._0_4_;
  *(undefined4 *)
   ((long)&(pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.filename
           ._M_str + 4) = local_d8.filename._M_str._4_4_;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.type_ = DataSegment;
  (pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__DataSegmentModuleField_001a4168;
  (pDVar3->data_segment).kind = Active;
  (pDVar3->data_segment).name._M_dataplus._M_p = (pointer)&(pDVar3->data_segment).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(pDVar3->data_segment).name,local_b8.loc.filename._M_len,
             local_b8.loc.filename._M_str + local_b8.loc.filename._M_len);
  this_00 = &(pDVar3->data_segment).memory_var;
  Var::Var(this_00);
  out_expr_list = &(pDVar3->data_segment).offset;
  (pDVar3->data_segment).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar3->data_segment).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar3->data_segment).offset.size_ = 0;
  (pDVar3->data_segment).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar3->data_segment).offset.first_ = (Expr *)0x0;
  (pDVar3->data_segment).offset.last_ = (Expr *)0x0;
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    RVar2 = Expect(this,Lpar);
    EVar4 = Error;
    if ((((RVar2.enum_ == Error) || (RVar2 = Expect(this,Memory), RVar2.enum_ == Error)) ||
        (RVar2 = ParseVar(this,this_00), RVar2.enum_ == Error)) ||
       (RVar2 = Expect(this,Rpar), RVar2.enum_ == Error)) goto LAB_0013b033;
    RVar2 = ParseOffsetExpr(this,out_expr_list);
LAB_0013af8a:
    EVar4 = Error;
    if (RVar2.enum_ == Error) goto LAB_0013b033;
  }
  else {
    Var::Var(&local_78,0,&local_d8);
    bVar1 = ParseVarOpt(this,this_00,&local_78);
    Var::~Var(&local_78);
    if (bVar1) {
      RVar2 = ParseOffsetExpr(this,out_expr_list);
      goto LAB_0013af8a;
    }
    bVar1 = ParseOffsetExprOpt(this,out_expr_list);
    if (!bVar1) {
      if ((this->options_->features).bulk_memory_enabled_ == false) {
        Error(this,0x17a789);
        EVar4 = Error;
        goto LAB_0013b033;
      }
      (pDVar3->data_segment).kind = Passive;
    }
  }
  ParseTextListOpt(this,&(pDVar3->data_segment).data);
  RVar2 = Expect(this,Rpar);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    local_e0._M_head_impl = pDVar3;
    Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                *)&local_e0);
    if (local_e0._M_head_impl != (DataSegmentModuleField *)0x0) {
      (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_e0._M_head_impl = (DataSegmentModuleField *)0x0;
    EVar4 = Ok;
    pDVar3 = (DataSegmentModuleField *)0x0;
  }
LAB_0013b033:
  if (pDVar3 != (DataSegmentModuleField *)0x0) {
    (*(pDVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField
      [1])(pDVar3);
  }
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b8.loc.filename._M_len !=
      &local_b8.loc.field_1) {
    operator_delete((void *)local_b8.loc.filename._M_len,
                    CONCAT71(local_b8.loc.field_1.field_1.offset._1_7_,
                             local_b8.loc.field_1.field2[0]) + 1);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = std::make_unique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}